

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestNoSuchCommand::Run(SubprocessTestNoSuchCommand *this)

{
  SubprocessSet *this_00;
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_01;
  string *__rhs;
  allocator<char> local_41;
  string local_40;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ninja_no_such_command",&local_41);
  this_01 = SubprocessSet::Add(this_00,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x55,"(Subprocess *) 0 != subproc");
  if (bVar2) {
    (this->super_SubprocessTest).subprocs_.token_available_ = false;
    while( true ) {
      bVar2 = Subprocess::Done(this_01);
      if (bVar2) break;
      SubprocessSet::DoWork(this_00,(TokenPool *)0x0);
    }
    bVar2 = testing::Test::Check
                      (g_current_test,
                       (bool)((this->super_SubprocessTest).subprocs_.token_available_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x5c,"subprocs_.IsTokenAvailable()");
    pTVar1 = g_current_test;
    if (bVar2) {
      EVar3 = Subprocess::Finish(this_01);
      testing::Test::Check
                (pTVar1,EVar3 == ExitFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                 ,0x5e,"ExitFailure == subproc->Finish()");
      pTVar1 = g_current_test;
      __rhs = Subprocess::GetOutput_abi_cxx11_(this_01);
      bVar2 = std::operator!=("",__rhs);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                 ,0x5f,"\"\" != subproc->GetOutput()");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, NoSuchCommand) {
  Subprocess* subproc = subprocs_.Add("ninja_no_such_command");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    // Pretend we discovered that stderr was ready for writing.
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitFailure, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());
#ifdef _WIN32
  ASSERT_EQ("CreateProcess failed: The system cannot find the file "
            "specified.\n", subproc->GetOutput());
#endif
}